

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTransformFeedbackTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::TransformFeedback::ArrayElementCase::ArrayElementCase
          (ArrayElementCase *this,Context *context,char *name,char *desc,deUint32 bufferType,
          deUint32 primitiveType,DataType type,Precision precision,Interpolation interpolation)

{
  ProgramSpec *this_00;
  VarType VStack_58;
  VarType local_40;
  
  TransformFeedbackCase::TransformFeedbackCase
            (&this->super_TransformFeedbackCase,context,name,desc,bufferType,primitiveType);
  (this->super_TransformFeedbackCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TransformFeedbackCase_01e295b0;
  glu::VarType::VarType(&VStack_58,type,precision);
  glu::VarType::VarType(&local_40,&VStack_58,3);
  this_00 = &(this->super_TransformFeedbackCase).m_progSpec;
  ProgramSpec::addVarying(this_00,"v_varA",&local_40,interpolation);
  glu::VarType::~VarType(&local_40);
  glu::VarType::~VarType(&VStack_58);
  glu::VarType::VarType(&VStack_58,type,precision);
  glu::VarType::VarType(&local_40,&VStack_58,4);
  ProgramSpec::addVarying(this_00,"v_varB",&local_40,interpolation);
  glu::VarType::~VarType(&local_40);
  glu::VarType::~VarType(&VStack_58);
  ProgramSpec::addTransformFeedbackVarying(this_00,"v_varA[1]");
  ProgramSpec::addTransformFeedbackVarying(this_00,"v_varB[0]");
  ProgramSpec::addTransformFeedbackVarying(this_00,"v_varB[3]");
  return;
}

Assistant:

ArrayElementCase (Context& context, const char* name, const char* desc, deUint32 bufferType, deUint32 primitiveType, glu::DataType type, glu::Precision precision, Interpolation interpolation)
		: TransformFeedbackCase(context, name, desc, bufferType, primitiveType)
	{
		m_progSpec.addVarying("v_varA", glu::VarType(glu::VarType(type, precision), 3), interpolation);
		m_progSpec.addVarying("v_varB", glu::VarType(glu::VarType(type, precision), 4), interpolation);

		m_progSpec.addTransformFeedbackVarying("v_varA[1]");
		m_progSpec.addTransformFeedbackVarying("v_varB[0]");
		m_progSpec.addTransformFeedbackVarying("v_varB[3]");
	}